

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glcTestRunner.cpp
# Opt level: O0

string * glcts::getCaseListFileOption
                   (string *__return_storage_ptr__,string *mustpassDir,string *apiName,
                   string *mustpassName)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  allocator<char> local_49;
  undefined1 local_48 [8];
  string case_list_option;
  string *mustpassName_local;
  string *apiName_local;
  string *mustpassDir_local;
  
  case_list_option.field_2._8_8_ = mustpassName;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_48,"--deqp-caselist-file=",&local_49);
  std::allocator<char>::~allocator(&local_49);
  std::operator+(&local_e0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_48,
                 mustpassDir);
  std::operator+(&local_c0,&local_e0,apiName);
  std::operator+(&local_a0,&local_c0,"-");
  std::operator+(&local_80,&local_a0,mustpassName);
  std::operator+(__return_storage_ptr__,&local_80,".txt");
  std::__cxx11::string::~string((string *)&local_80);
  std::__cxx11::string::~string((string *)&local_a0);
  std::__cxx11::string::~string((string *)&local_c0);
  std::__cxx11::string::~string((string *)&local_e0);
  std::__cxx11::string::~string((string *)local_48);
  return __return_storage_ptr__;
}

Assistant:

static const string getCaseListFileOption(const string mustpassDir, const string apiName, const string mustpassName)
{
#if DE_OS == DE_OS_ANDROID
	const string case_list_option = "--deqp-caselist-resource=";
#else
	const string case_list_option = "--deqp-caselist-file=";
#endif
	return case_list_option + mustpassDir + apiName + "-" + mustpassName + ".txt";
}